

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_sort.cc
# Opt level: O2

void print_usage(char *progname)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"Usage: ");
  poVar1 = std::operator<<(poVar1,progname);
  std::operator<<(poVar1," [-pa] [path]\n");
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,
                  " -p       - \'p\' letter is treated as \'patch\' instead of \'pre\'\n");
  std::operator<<((ostream *)&std::cerr,
                  " -a       - any alphabetic characters are treated as post-release\n");
  std::operator<<((ostream *)&std::cerr,
                  " -v       - verbose mode (display whether version is different from the previous one)\n"
                 );
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr," -h, -?   - print usage and exit\n");
  poVar1 = std::operator<<((ostream *)&std::cerr," -V       - print version and exit");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

static void print_usage(const char* progname) {
	std::cerr << "Usage: " << progname << " [-pa] [path]\n";
	std::cerr << "\n";
	std::cerr << " -p       - 'p' letter is treated as 'patch' instead of 'pre'\n";
	std::cerr << " -a       - any alphabetic characters are treated as post-release\n";
	std::cerr << " -v       - verbose mode (display whether version is different from the previous one)\n";
	std::cerr << "\n";
	std::cerr << " -h, -?   - print usage and exit\n";
	std::cerr << " -V       - print version and exit" << std::endl;
}